

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

void update_cdf(aom_cdf_prob *cdf,int8_t val,int nsymbs)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  long lVar5;
  
  uVar1 = cdf[(uint)nsymbs];
  bVar4 = (char)(uVar1 >> 4) + (3 < nsymbs) + 4;
  lVar5 = 0;
  do {
    uVar2 = cdf[lVar5];
    if (lVar5 < (int)CONCAT71(in_register_00000031,val)) {
      sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
    }
    else {
      sVar3 = -(uVar2 >> (bVar4 & 0x1f));
    }
    cdf[lVar5] = sVar3 + uVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 < nsymbs + -1);
  cdf[(uint)nsymbs] = cdf[(uint)nsymbs] + (ushort)(uVar1 < 0x20);
  return;
}

Assistant:

static inline void update_cdf(aom_cdf_prob *cdf, int8_t val, int nsymbs) {
  assert(nsymbs < 17);
  const int count = cdf[nsymbs];

  // rate is computed in the spec as:
  //  3 + ( cdf[N] > 15 ) + ( cdf[N] > 31 ) + Min(FloorLog2(N), 2)
  // In this case cdf[N] is |count|.
  // Min(FloorLog2(N), 2) is 1 for nsymbs == {2, 3} and 2 for all
  // nsymbs > 3. So the equation becomes:
  //  4 + (count > 15) + (count > 31) + (nsymbs > 3).
  // Note that the largest value for count is 32 (it is not incremented beyond
  // 32). So using that information:
  //  count >> 4 is 0 for count from 0 to 15.
  //  count >> 4 is 1 for count from 16 to 31.
  //  count >> 4 is 2 for count == 31.
  // Now, the equation becomes:
  //  4 + (count >> 4) + (nsymbs > 3).
  const int rate = 4 + (count >> 4) + (nsymbs > 3);

  int i = 0;
  do {
    if (i < val) {
      cdf[i] += (CDF_PROB_TOP - cdf[i]) >> rate;
    } else {
      cdf[i] -= cdf[i] >> rate;
    }
  } while (++i < nsymbs - 1);
  cdf[nsymbs] += (count < 32);
}